

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op<std::multiplies<float>>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  float fVar4;
  int i_14;
  int i_13;
  float b0_6;
  int x_3;
  float a0_6;
  int y_3;
  float *outptr_12;
  float *ptr1_8;
  int i_12;
  float *outptr_11;
  float *ptr1_7;
  float a0_5;
  int q_10;
  int i_11;
  float a0_4;
  int i_10;
  float a0_3;
  int i_9;
  float *outptr_10;
  float *ptr1_6;
  int q_9;
  float a0_2;
  int x_2;
  float b0_5;
  int y_2;
  float *outptr_9;
  float *ptr_8;
  int i_8;
  float b0_4;
  int i_7;
  int x_1;
  float a0_1;
  int y_1;
  float *outptr_8;
  float *ptr1_5;
  float *ptr_7;
  int q_8;
  int i_6;
  float *outptr_7;
  float b0_3;
  float *ptr_6;
  int q_7;
  int i_5;
  float *outptr_6;
  float *ptr_5;
  int q_6;
  float b0_2;
  int x;
  float b0_1;
  int y;
  float *outptr_5;
  float *ptr1_4;
  float *ptr_4;
  int q_5;
  int i_4;
  float *outptr_4;
  float *ptr1_3;
  float *ptr_3;
  int q_4;
  int i_3;
  float *outptr_3;
  float *ptr1_2;
  float *ptr_2;
  int q_3;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *a0;
  int q_2;
  int i_1;
  float *outptr_1;
  float *ptr1;
  float *ptr_1;
  int q_1;
  int i;
  float *outptr;
  float *b0;
  float *ptr;
  int q;
  int size1;
  int channels1;
  int h1;
  int w1;
  size_t elemsize;
  int size;
  int channels;
  int h;
  int w;
  multiplies<float> op;
  undefined4 in_stack_fffffffffffff6a0;
  int in_stack_fffffffffffff6a4;
  Mat *in_stack_fffffffffffff6a8;
  size_t in_stack_fffffffffffff6b0;
  int _c;
  int in_stack_fffffffffffff6b8;
  int in_stack_fffffffffffff6bc;
  Mat *in_stack_fffffffffffff6c0;
  int local_870;
  int local_86c;
  float local_868;
  int local_864;
  float local_860;
  int local_85c;
  float *local_858;
  float *local_850;
  int local_844;
  Mat local_840;
  float *local_800;
  Mat local_7f8;
  Mat *local_7b8;
  float local_7ac;
  int local_7a8;
  int local_7a4;
  float local_7a0;
  int local_79c;
  float local_798;
  int local_794;
  Mat local_790;
  float *local_750;
  Mat local_748;
  float *local_708;
  int local_6fc;
  float local_6f8;
  int local_6f4;
  float local_6f0;
  int local_6ec;
  float *local_6e8;
  float *local_6e0;
  int local_6d8;
  float local_6d4;
  int local_6d0;
  int local_6cc;
  float local_6c8;
  int local_6c4;
  Mat local_6c0;
  float *local_680;
  Mat local_678;
  float *local_638;
  float *local_630;
  int local_628;
  int local_624;
  Mat local_620;
  float *local_5e0;
  float local_5d4;
  Mat local_5d0;
  float *local_590;
  int local_588;
  int local_584;
  Mat local_580;
  float *local_540;
  Mat local_538;
  float *local_4f8;
  int local_4ec;
  float local_4e8;
  int local_4e4;
  float local_4e0;
  int local_4dc;
  Mat local_4d8;
  float *local_498;
  float *local_490;
  Mat local_488;
  float *local_448;
  int local_440;
  int local_43c;
  Mat local_438;
  float *local_3f8;
  Mat local_3f0;
  float *local_3b0;
  Mat local_3a8;
  float *local_368;
  int local_360;
  int local_35c;
  Mat local_358;
  float *local_318;
  Mat local_310;
  float *local_2d0;
  float *local_2c8;
  int local_2c0;
  int local_2bc;
  Mat local_2b8;
  float *local_278;
  Mat local_270;
  float *local_230;
  Mat local_228;
  float *local_1e8;
  int local_1e0;
  int local_1dc;
  Mat local_1d8;
  float *local_198;
  float *local_190;
  Mat local_188;
  float *local_148;
  int local_140;
  int local_13c;
  Mat local_138;
  float *local_f8;
  Mat local_f0;
  float *local_b0;
  Mat local_a8;
  float *local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  size_t local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  multiplies<float> local_29 [9];
  Mat *local_20;
  Mat *local_18;
  Mat *local_10;
  
  local_30 = in_RDI->w;
  local_34 = in_RDI->h;
  local_38 = in_RDI->c;
  local_3c = local_30 * local_34;
  local_48 = in_RDI->elemsize;
  local_4c = in_RSI->w;
  local_50 = in_RSI->h;
  local_54 = in_RSI->c;
  local_58 = local_4c * local_50;
  _c = (int)(in_stack_fffffffffffff6b0 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDI->dims == 3) {
    if (in_RSI->dims == 3) {
      if (((local_4c == 1) && (local_50 == 1)) && (local_54 == local_38)) {
        Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,_c
                    ,(size_t)in_stack_fffffffffffff6a8,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        if (!bVar1) {
          for (local_5c = 0; local_5c < local_38; local_5c = local_5c + 1) {
            Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
            pfVar2 = Mat::operator_cast_to_float_(&local_a8);
            Mat::~Mat((Mat *)0x17d9cd);
            local_68 = pfVar2;
            Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
            pfVar2 = Mat::operator_cast_to_float_(&local_f0);
            Mat::~Mat((Mat *)0x17da1b);
            local_b0 = pfVar2;
            Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
            pfVar2 = Mat::operator_cast_to_float_(&local_138);
            Mat::~Mat((Mat *)0x17da69);
            local_f8 = pfVar2;
            for (local_13c = 0; local_13c < local_3c; local_13c = local_13c + 1) {
              fVar4 = std::multiplies<float>::operator()(local_29,local_68 + local_13c,local_b0);
              local_f8[local_13c] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_4c == local_30) && (local_50 == local_34)) && (local_54 == 1)) {
        Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,_c
                    ,(size_t)in_stack_fffffffffffff6a8,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        if (!bVar1) {
          for (local_140 = 0; local_140 < local_38; local_140 = local_140 + 1) {
            Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
            pfVar2 = Mat::operator_cast_to_float_(&local_188);
            Mat::~Mat((Mat *)0x17dbfc);
            local_148 = pfVar2;
            local_190 = Mat::operator_cast_to_float_(local_18);
            Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
            pfVar2 = Mat::operator_cast_to_float_(&local_1d8);
            Mat::~Mat((Mat *)0x17dc5f);
            local_198 = pfVar2;
            for (local_1dc = 0; local_1dc < local_3c; local_1dc = local_1dc + 1) {
              fVar4 = std::multiplies<float>::operator()
                                (local_29,local_148 + local_1dc,local_190 + local_1dc);
              local_198[local_1dc] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_30 == 1) && (local_34 == 1)) && (local_54 == local_38)) {
        Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,_c
                    ,(size_t)in_stack_fffffffffffff6a8,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        if (!bVar1) {
          for (local_1e0 = 0; local_1e0 < local_54; local_1e0 = local_1e0 + 1) {
            Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
            pfVar2 = Mat::operator_cast_to_float_(&local_228);
            Mat::~Mat((Mat *)0x17ddfb);
            local_1e8 = pfVar2;
            Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
            pfVar2 = Mat::operator_cast_to_float_(&local_270);
            Mat::~Mat((Mat *)0x17de49);
            local_230 = pfVar2;
            Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
            pfVar2 = Mat::operator_cast_to_float_(&local_2b8);
            Mat::~Mat((Mat *)0x17de97);
            local_278 = pfVar2;
            for (local_2bc = 0; local_2bc < local_58; local_2bc = local_2bc + 1) {
              fVar4 = std::multiplies<float>::operator()(local_29,local_1e8,local_230 + local_2bc);
              local_278[local_2bc] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_4c == local_30) && (local_50 == local_34)) && (local_38 == 1)) {
        Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,_c
                    ,(size_t)in_stack_fffffffffffff6a8,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        if (!bVar1) {
          for (local_2c0 = 0; local_2c0 < local_54; local_2c0 = local_2c0 + 1) {
            local_2c8 = Mat::operator_cast_to_float_(local_10);
            Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
            pfVar2 = Mat::operator_cast_to_float_(&local_310);
            Mat::~Mat((Mat *)0x17e03f);
            local_2d0 = pfVar2;
            Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
            pfVar2 = Mat::operator_cast_to_float_(&local_358);
            Mat::~Mat((Mat *)0x17e08d);
            local_318 = pfVar2;
            for (local_35c = 0; local_35c < local_58; local_35c = local_35c + 1) {
              fVar4 = std::multiplies<float>::operator()
                                (local_29,local_2c8 + local_35c,local_2d0 + local_35c);
              local_318[local_35c] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,_c,
                  (size_t)in_stack_fffffffffffff6a8,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
      bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
      if (!bVar1) {
        for (local_360 = 0; local_360 < local_38; local_360 = local_360 + 1) {
          Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
          pfVar2 = Mat::operator_cast_to_float_(&local_3a8);
          Mat::~Mat((Mat *)0x17e1f9);
          local_368 = pfVar2;
          Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
          pfVar2 = Mat::operator_cast_to_float_(&local_3f0);
          Mat::~Mat((Mat *)0x17e247);
          local_3b0 = pfVar2;
          Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
          pfVar2 = Mat::operator_cast_to_float_(&local_438);
          Mat::~Mat((Mat *)0x17e295);
          local_3f8 = pfVar2;
          for (local_43c = 0; local_43c < local_3c; local_43c = local_43c + 1) {
            fVar4 = std::multiplies<float>::operator()
                              (local_29,local_368 + local_43c,local_3b0 + local_43c);
            local_3f8[local_43c] = fVar4;
          }
        }
        return 0;
      }
      return -100;
    }
    Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,_c,
                (size_t)in_stack_fffffffffffff6a8,
                (Allocator *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
    if (bVar1) {
      return -100;
    }
    if (local_18->dims == 2) {
      for (local_440 = 0; local_440 < local_38; local_440 = local_440 + 1) {
        Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
        pfVar2 = Mat::operator_cast_to_float_(&local_488);
        Mat::~Mat((Mat *)0x17e413);
        local_448 = pfVar2;
        local_490 = Mat::row(local_18,local_440);
        Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
        pfVar2 = Mat::operator_cast_to_float_(&local_4d8);
        Mat::~Mat((Mat *)0x17e47d);
        local_498 = pfVar2;
        for (local_4dc = 0; local_4dc < local_34; local_4dc = local_4dc + 1) {
          local_4e0 = local_490[local_4dc];
          for (local_4e4 = 0; local_4e4 < local_30; local_4e4 = local_4e4 + 1) {
            fVar4 = std::multiplies<float>::operator()(local_29,local_448 + local_4e4,&local_4e0);
            local_498[local_4e4] = fVar4;
          }
          local_448 = local_448 + local_30;
          local_498 = local_498 + local_30;
        }
      }
      return 0;
    }
    if (local_18->dims == 1) {
      if (local_18->w == 1) {
        pfVar2 = Mat::operator[](local_18,0);
        local_4e8 = *pfVar2;
        for (local_4ec = 0; local_4ec < local_38; local_4ec = local_4ec + 1) {
          Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
          pfVar2 = Mat::operator_cast_to_float_(&local_538);
          Mat::~Mat((Mat *)0x17e655);
          local_4f8 = pfVar2;
          Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
          pfVar2 = Mat::operator_cast_to_float_(&local_580);
          Mat::~Mat((Mat *)0x17e69d);
          local_540 = pfVar2;
          for (local_584 = 0; local_584 < local_3c; local_584 = local_584 + 1) {
            fVar4 = std::multiplies<float>::operator()(local_29,local_4f8 + local_584,&local_4e8);
            local_540[local_584] = fVar4;
          }
        }
        return 0;
      }
      for (local_588 = 0; local_588 < local_38; local_588 = local_588 + 1) {
        Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
        pfVar2 = Mat::operator_cast_to_float_(&local_5d0);
        Mat::~Mat((Mat *)0x17e79b);
        local_590 = pfVar2;
        pfVar2 = Mat::operator[](local_18,(long)local_588);
        local_5d4 = *pfVar2;
        Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
        pfVar2 = Mat::operator_cast_to_float_(&local_620);
        Mat::~Mat((Mat *)0x17e805);
        local_5e0 = pfVar2;
        for (local_624 = 0; local_624 < local_3c; local_624 = local_624 + 1) {
          fVar4 = std::multiplies<float>::operator()(local_29,local_590 + local_624,&local_5d4);
          local_5e0[local_624] = fVar4;
        }
      }
      return 0;
    }
  }
  else {
    local_20 = in_RDX;
    if (in_RDI->dims == 2) {
      if (in_RSI->dims == 3) {
        Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,_c
                    ,(size_t)in_stack_fffffffffffff6a8,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        if (!bVar1) {
          for (local_628 = 0; local_628 < local_54; local_628 = local_628 + 1) {
            local_630 = Mat::row(local_10,local_628);
            Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
            pfVar2 = Mat::operator_cast_to_float_(&local_678);
            Mat::~Mat((Mat *)0x17e9a1);
            local_638 = pfVar2;
            Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
            pfVar2 = Mat::operator_cast_to_float_(&local_6c0);
            Mat::~Mat((Mat *)0x17e9e9);
            local_680 = pfVar2;
            for (local_6c4 = 0; local_6c4 < local_50; local_6c4 = local_6c4 + 1) {
              local_6c8 = local_630[local_6c4];
              for (local_6cc = 0; local_6cc < local_4c; local_6cc = local_6cc + 1) {
                fVar4 = std::multiplies<float>::operator()
                                  (local_29,&local_6c8,local_638 + local_6cc);
                local_680[local_6cc] = fVar4;
              }
              local_638 = local_638 + local_4c;
              local_680 = local_680 + local_4c;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,
                  in_stack_fffffffffffff6b0,(Allocator *)in_stack_fffffffffffff6a8);
      bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
      if (bVar1) {
        return -100;
      }
      if (local_18->dims == 2) {
        for (local_6d0 = 0; local_6d0 < local_3c; local_6d0 = local_6d0 + 1) {
          pfVar2 = Mat::operator[](local_10,(long)local_6d0);
          pfVar3 = Mat::operator[](local_18,(long)local_6d0);
          fVar4 = std::multiplies<float>::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,(long)local_6d0);
          *pfVar2 = fVar4;
        }
        return 0;
      }
      if (local_18->dims == 1) {
        Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,
                    in_stack_fffffffffffff6b0,(Allocator *)in_stack_fffffffffffff6a8);
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_6d4 = *pfVar2;
          for (local_6d8 = 0; local_6d8 < local_3c; local_6d8 = local_6d8 + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_6d8);
            fVar4 = std::multiplies<float>::operator()(local_29,pfVar2,&local_6d4);
            pfVar2 = Mat::operator[](local_20,(long)local_6d8);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        local_6e0 = Mat::operator_cast_to_float_(local_10);
        local_6e8 = Mat::operator_cast_to_float_(local_20);
        for (local_6ec = 0; local_6ec < local_34; local_6ec = local_6ec + 1) {
          pfVar2 = Mat::operator[](local_18,(long)local_6ec);
          local_6f0 = *pfVar2;
          for (local_6f4 = 0; local_6f4 < local_30; local_6f4 = local_6f4 + 1) {
            fVar4 = std::multiplies<float>::operator()(local_29,local_6e0 + local_6f4,&local_6f0);
            local_6e8[local_6f4] = fVar4;
          }
          local_6e0 = local_6e0 + local_30;
          local_6e8 = local_6e8 + local_30;
        }
        return 0;
      }
    }
    else if (in_RDI->dims == 1) {
      if (in_RDI->w == 1) {
        if (in_RSI->dims == 3) {
          Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,
                      _c,(size_t)in_stack_fffffffffffff6a8,
                      (Allocator *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
          bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_6f8 = *pfVar2;
            for (local_6fc = 0; local_6fc < local_54; local_6fc = local_6fc + 1) {
              Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
              pfVar2 = Mat::operator_cast_to_float_(&local_748);
              Mat::~Mat((Mat *)0x17efa2);
              local_708 = pfVar2;
              Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
              pfVar2 = Mat::operator_cast_to_float_(&local_790);
              Mat::~Mat((Mat *)0x17efea);
              local_750 = pfVar2;
              for (local_794 = 0; local_794 < local_58; local_794 = local_794 + 1) {
                fVar4 = std::multiplies<float>::operator()
                                  (local_29,&local_6f8,local_708 + local_794);
                local_750[local_794] = fVar4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 2) {
          Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,
                      in_stack_fffffffffffff6b0,(Allocator *)in_stack_fffffffffffff6a8);
          bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_798 = *pfVar2;
            for (local_79c = 0; local_79c < local_58; local_79c = local_79c + 1) {
              pfVar2 = Mat::operator[](local_18,(long)local_79c);
              fVar4 = std::multiplies<float>::operator()(local_29,&local_798,pfVar2);
              pfVar2 = Mat::operator[](local_20,(long)local_79c);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 1) {
          Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b0,
                      (Allocator *)in_stack_fffffffffffff6a8);
          bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_7a0 = *pfVar2;
            for (local_7a4 = 0; local_7a4 < local_4c; local_7a4 = local_7a4 + 1) {
              pfVar2 = Mat::operator[](local_18,(long)local_7a4);
              fVar4 = std::multiplies<float>::operator()(local_29,&local_7a0,pfVar2);
              pfVar2 = Mat::operator[](local_20,(long)local_7a4);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
      }
      if (in_RSI->dims == 3) {
        Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,_c
                    ,(size_t)in_stack_fffffffffffff6a8,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        if (!bVar1) {
          for (local_7a8 = 0; local_7a8 < local_54; local_7a8 = local_7a8 + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_7a8);
            local_7ac = *pfVar2;
            Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
            in_stack_fffffffffffff6a8 = (Mat *)Mat::operator_cast_to_float_(&local_7f8);
            Mat::~Mat((Mat *)0x17f394);
            local_7b8 = in_stack_fffffffffffff6a8;
            Mat::channel(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4);
            pfVar2 = Mat::operator_cast_to_float_(&local_840);
            Mat::~Mat((Mat *)0x17f3dc);
            local_800 = pfVar2;
            for (local_844 = 0; local_844 < local_58; local_844 = local_844 + 1) {
              fVar4 = std::multiplies<float>::operator()
                                (local_29,&local_7ac,
                                 (float *)((long)&local_7b8->data + (long)local_844 * 4));
              local_800[local_844] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 2) {
        Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,
                    in_stack_fffffffffffff6b0,(Allocator *)in_stack_fffffffffffff6a8);
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        if (!bVar1) {
          local_850 = Mat::operator_cast_to_float_(local_18);
          local_858 = Mat::operator_cast_to_float_(local_20);
          for (local_85c = 0; local_85c < local_50; local_85c = local_85c + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_85c);
            local_860 = *pfVar2;
            for (local_864 = 0; local_864 < local_4c; local_864 = local_864 + 1) {
              fVar4 = std::multiplies<float>::operator()(local_29,&local_860,local_850 + local_864);
              local_858[local_864] = fVar4;
            }
            local_850 = local_850 + local_4c;
            local_858 = local_858 + local_4c;
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 1) {
        Mat::create(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b0,
                    (Allocator *)in_stack_fffffffffffff6a8);
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_868 = *pfVar2;
          for (local_86c = 0; local_86c < local_30; local_86c = local_86c + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_86c);
            fVar4 = std::multiplies<float>::operator()(local_29,pfVar2,&local_868);
            pfVar2 = Mat::operator[](local_20,(long)local_86c);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        for (local_870 = 0; local_870 < local_30; local_870 = local_870 + 1) {
          pfVar2 = Mat::operator[](local_10,(long)local_870);
          pfVar3 = Mat::operator[](local_18,(long)local_870);
          fVar4 = std::multiplies<float>::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,(long)local_870);
          *pfVar2 = fVar4;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;
    size_t elemsize = a.elemsize;

    int w1 = b.w;
    int h1 = b.h;
    int channels1 = b.c;
    int size1 = w1 * h1;

    if (a.dims == 3)
    {
        if (b.dims == 3)
        {
            if (w1 == 1 && h1 == 1 && channels1 == channels)
            {
                // special type 1
                c.create(w, h, channels, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* b0 = b.channel(q);
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = op(ptr[i], b0[0]);
                    }
                }

                return 0;
            }

            if (w1 == w && h1 == h && channels1 == 1)
            {
                // special type 2
                c.create(w, h, channels, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* ptr1 = b;
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = op(ptr[i], ptr1[i]);
                    }
                }

                return 0;
            }

            if (w == 1 && h == 1 && channels1 == channels)
            {
                // special type 3
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* a0 = a.channel(q);
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size1; i++)
                    {
                        outptr[i] = op(a0[0], ptr1[i]);
                    }
                }

                return 0;
            }

            if (w1 == w && h1 == h && channels == 1)
            {
                // special type 4
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* ptr = a;
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size1; i++)
                    {
                        outptr[i] = op(ptr[i], ptr1[i]);
                    }
                }

                return 0;
            }

            // type 19
            c.create(w, h, channels, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = op(ptr[i], ptr1[i]);
                }
            }

            return 0;
        }

        c.create(w, h, channels, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 2)
        {
            // type 18
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = b.row(q);
                float* outptr = c.channel(q);

                for (int y=0; y<h; y++)
                {
                    const float b0 = ptr1[y];
                    for (int x=0; x<w; x++)
                    {
                        outptr[x] = op(ptr[x], b0);
                    }

                    ptr += w;
                    outptr += w;
                }
            }

            return 0;
        }

        if (b.dims == 1)
        {
            if (b.w == 1)
            {
                // type 16
                const float b0 = b[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = a.channel(q);
                    float* outptr = c.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] = op(ptr[i], b0);
                    }
                }

                return 0;
            }

            // type 17
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float b0 = b[q];
                float* outptr = c.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = op(ptr[i], b0);
                }
            }

            return 0;
        }
    }
    else if (a.dims == 2)
    {
        if (b.dims == 3)
        {
            // type 14
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels1; q++)
            {
                const float* ptr = a.row(q);
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int y=0; y<h1; y++)
                {
                    const float a0 = ptr[y];
                    for (int x=0; x<w1; x++)
                    {
                        outptr[x] = op(a0, ptr1[x]);
                    }

                    ptr1 += w1;
                    outptr += w1;
                }
            }

            return 0;
        }

        c.create(w, h, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 2)
        {
            // type 13
            for (int i=0; i<size; i++)
            {
                c[i] = op(a[i], b[i]);
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, h, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                // type 11
                const float b0 = b[0];
                for (int i=0; i<size; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            // type 12
            const float* ptr = a;
            float* outptr = c;

            for (int y=0; y<h; y++)
            {
                const float b0 = b[y];
                for (int x=0; x<w; x++)
                {
                    outptr[x] = op(ptr[x], b0);
                }

                ptr += w;
                outptr += w;
            }

            return 0;
        }
    }
    else if (a.dims == 1)
    {
        if (a.w == 1)
        {
            if (b.dims == 3)
            {
                // type 4
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels1; q++)
                {
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int i=0; i<size1; i++)
                    {
                        outptr[i] = op(a0, ptr1[i]);
                    }
                }

                return 0;
            }

            if (b.dims == 2)
            {
                // type 3
                c.create(w1, h1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i=0; i<size1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }

            if (b.dims == 1)
            {
                // type 2
                c.create(w1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i=0; i<w1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }
        }

        if (b.dims == 3)
        {
            // type 9
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels1; q++)
            {
                const float a0 = a[q];
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i=0; i<size1; i++)
                {
                    outptr[i] = op(a0, ptr1[i]);
                }
            }

            return 0;
        }

        if (b.dims == 2)
        {
            // type 8
            c.create(w1, h1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            const float* ptr1 = b;
            float* outptr = c;

            for (int y=0; y<h1; y++)
            {
                const float a0 = a[y];
                for (int x=0; x<w1; x++)
                {
                    outptr[x] = op(a0, ptr1[x]);
                }

                ptr1 += w1;
                outptr += w1;
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                // type 6
                const float b0 = b[0];
                for (int i=0; i<w; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            // type 7
            for (int i=0; i<w; i++)
            {
                c[i] = op(a[i], b[i]);
            }
        }
    }

    return 0;
}